

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzwrite.c
# Opt level: O1

int gzputs(gzFile file,char *str)

{
  uint uVar1;
  size_t sVar2;
  
  sVar2 = strlen(str);
  uVar1 = gzwrite(file,str,(uint)sVar2);
  if (uVar1 == 0) {
    uVar1 = -(uint)((uint)sVar2 != 0) | uVar1;
  }
  return uVar1;
}

Assistant:

int ZEXPORT gzputs(gzFile file, const char *str)
{
    int ret;
    unsigned len;

    /* write string */
    len = (unsigned)strlen(str);
    ret = gzwrite(file, str, len);
    return ret == 0 && len != 0 ? -1 : ret;
}